

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSProperty * add_property(JSContext *ctx,JSObject *p,JSAtom prop,int prop_flags)

{
  JSShape **psh;
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  JSProperty *pJVar5;
  JSShape *pJVar6;
  ulong uVar7;
  ulong uVar8;
  JSRuntime *rt;
  JSShape **ppJVar9;
  JSShape *pJVar10;
  
  psh = &p->shape;
  pJVar6 = p->shape;
  if (pJVar6->is_hashed != '\0') {
    rt = ctx->rt;
    uVar3 = ((pJVar6->hash + prop) * -0x61c8ffff + prop_flags) * -0x61c8ffff;
    ppJVar9 = rt->shape_hash + (uVar3 >> (-(char)rt->shape_hash_bits & 0x1fU));
    while (pJVar10 = *ppJVar9, pJVar10 != (JSShape *)0x0) {
      if (((pJVar10->hash == uVar3) && (pJVar10->proto == pJVar6->proto)) &&
         (uVar7 = (ulong)(uint)pJVar6->prop_count, pJVar10->prop_count == pJVar6->prop_count + 1U))
      {
        uVar8 = 0;
        while (uVar7 != uVar8) {
          if ((*(int *)(&pJVar10[1].header.field_0x4 + uVar8 * 8) !=
               *(int *)(&pJVar6[1].header.field_0x4 + uVar8 * 8)) ||
             (lVar1 = uVar8 * 2, lVar2 = uVar8 * 2, uVar8 = uVar8 + 1,
             0x3ffffff <
             (uint)((&pJVar6[1].header.ref_count)[lVar1] ^ (&pJVar10[1].header.ref_count)[lVar2])))
          goto LAB_0011bb4d;
        }
        if ((*(JSAtom *)(&pJVar10[1].header.field_0x4 + uVar7 * 8) == prop) &&
           ((uint)(&pJVar10[1].header.ref_count)[uVar7 * 2] >> 0x1a == prop_flags)) {
          if (pJVar10->prop_size != pJVar6->prop_size) {
            pJVar5 = (JSProperty *)js_realloc(ctx,p->prop,(long)pJVar10->prop_size << 4);
            if (pJVar5 == (JSProperty *)0x0) {
              return (JSProperty *)0x0;
            }
            p->prop = pJVar5;
            rt = ctx->rt;
          }
          (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
          *psh = pJVar10;
          js_free_shape(rt,pJVar6);
          goto LAB_0011bbfd;
        }
      }
LAB_0011bb4d:
      ppJVar9 = &pJVar10->shape_hash_next;
    }
    if ((pJVar6->header).ref_count != 1) {
      pJVar6 = js_clone_shape(ctx,pJVar6);
      if (pJVar6 == (JSShape *)0x0) {
        return (JSProperty *)0x0;
      }
      pJVar6->is_hashed = '\x01';
      js_shape_hash_link(ctx->rt,pJVar6);
      js_free_shape(ctx->rt,*psh);
      *psh = pJVar6;
    }
  }
  iVar4 = add_shape_property(ctx,psh,p,prop,prop_flags);
  if (iVar4 != 0) {
    return (JSProperty *)0x0;
  }
  pJVar10 = *psh;
LAB_0011bbfd:
  return p->prop + (long)pJVar10->prop_count + -1;
}

Assistant:

static JSProperty *add_property(JSContext *ctx,
                                JSObject *p, JSAtom prop, int prop_flags)
{
    JSShape *sh, *new_sh;

    sh = p->shape;
    if (sh->is_hashed) {
        /* try to find an existing shape */
        new_sh = find_hashed_shape_prop(ctx->rt, sh, prop, prop_flags);
        if (new_sh) {
            /* matching shape found: use it */
            /*  the property array may need to be resized */
            if (new_sh->prop_size != sh->prop_size) {
                JSProperty *new_prop;
                new_prop = js_realloc(ctx, p->prop, sizeof(p->prop[0]) *
                                      new_sh->prop_size);
                if (!new_prop)
                    return NULL;
                p->prop = new_prop;
            }
            p->shape = js_dup_shape(new_sh);
            js_free_shape(ctx->rt, sh);
            return &p->prop[new_sh->prop_count - 1];
        } else if (sh->header.ref_count != 1) {
            /* if the shape is shared, clone it */
            new_sh = js_clone_shape(ctx, sh);
            if (!new_sh)
                return NULL;
            /* hash the cloned shape */
            new_sh->is_hashed = TRUE;
            js_shape_hash_link(ctx->rt, new_sh);
            js_free_shape(ctx->rt, p->shape);
            p->shape = new_sh;
        }
    }
    assert(p->shape->header.ref_count == 1);
    if (add_shape_property(ctx, &p->shape, p, prop, prop_flags))
        return NULL;
    return &p->prop[p->shape->prop_count - 1];
}